

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall sjtu::exception::exception(exception *this)

{
  char *__end;
  
  this->_vptr_exception = (_func_int **)&PTR_what_abi_cxx11__001238a0;
  (this->variant)._M_dataplus._M_p = (pointer)&(this->variant).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->variant,"","");
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->detail,"","");
  return;
}

Assistant:

exception() {}